

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O1

void test_evp_value_init(void)

{
  size_type *psVar1;
  size_type *psVar2;
  size_type *psVar3;
  _Alloc_hider _Var4;
  int iVar5;
  size_type *local_a0;
  opt_t o_;
  undefined8 local_6f;
  size_type *local_60;
  opt_t o1;
  opt_t oE;
  
  psVar3 = &o_.
            super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .super_type.value_._M_string_length;
  o_.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_dataplus._M_p = (pointer)0x0;
  o_.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_string_length._0_1_ = 0;
  psVar1 = &oE.
            super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .super_type.value_._M_string_length;
  local_a0 = psVar3;
  o1.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             ((long)&o1.
                     super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .super_type.value_.field_2 + 8),"one","");
  _Var4 = oE.
          super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .super_type.value_._M_dataplus;
  psVar2 = &o1.
            super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .super_type.value_._M_string_length;
  local_60 = psVar2;
  if ((size_type *)
      o1.
      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .super_type.value_.field_2._8_8_ != psVar1) {
    local_60 = (size_type *)
               o1.
               super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .super_type.value_.field_2._8_8_;
  }
  o1.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_dataplus =
       oE.
       super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .super_type.value_._M_dataplus;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_string_length._0_1_ = 0;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_string_length._1_7_ = (undefined7)local_6f;
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._M_local_buf[0] = (char)((ulong)local_6f >> 0x38);
  oE.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_._M_dataplus._M_p = (pointer)0x0;
  if (o_.
      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .super_type.value_._M_dataplus._M_p != (pointer)0x0) {
    o1.
    super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .super_type.value_.field_2._8_8_ = psVar1;
    __assert_fail("!o_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa7,"void test_evp_value_init()");
  }
  if (_Var4._M_p == (pointer)0x0) {
    o1.
    super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .super_type.value_.field_2._8_8_ = psVar1;
    __assert_fail("o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa8,"void test_evp_value_init()");
  }
  o1.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type.value_.field_2._8_8_ = psVar1;
  iVar5 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar5 != 0) {
    __assert_fail("o1.value() == \"one\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xab,"void test_evp_value_init()");
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_a0);
  if (iVar5 != 0) {
    __assert_fail("o_.unsafe_raw_value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xad,"void test_evp_value_init()");
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar5 != 0) {
    __assert_fail("o1.unsafe_raw_value() == \"one\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xae,"void test_evp_value_init()");
  }
  iVar5 = std::__cxx11::string::compare
                    (o1.
                     super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .super_type.value_.field_2._M_local_buf + 8);
  if (iVar5 == 0) {
    if ((size_type *)
        o1.
        super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .super_type.value_.field_2._8_8_ != psVar1) {
      operator_delete((void *)o1.
                              super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .super_type.value_.field_2._8_8_);
    }
    if (local_60 != psVar2) {
      operator_delete(local_60);
    }
    if (local_a0 != psVar3) {
      operator_delete(local_a0);
    }
    return;
  }
  __assert_fail("oE.unsafe_raw_value() == \"\"",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,0xaf,"void test_evp_value_init()");
}

Assistant:

void test_evp_value_init()
{
  {
    typedef compact_optional<evp_value_init<int>> opt_t;
    opt_t o_, o1 (1), oE(0);
    
    assert (!o_.has_value());
    assert ( o1.has_value());
    assert (!oE.has_value());
    
    assert (o1.value() == 1);
    
    assert (o_.unsafe_raw_value() == 0);
    assert (o1.unsafe_raw_value() == 1);
    assert (oE.unsafe_raw_value() == 0);
  }
  {
    typedef compact_optional<evp_value_init<std::string>> opt_t;
    opt_t o_, o1 (std::string("one")), oE ((std::string()));
    
    assert (!o_.has_value());
    assert ( o1.has_value());
    assert (!oE.has_value());
    
    assert (o1.value() == "one");
    
    assert (o_.unsafe_raw_value() == "");
    assert (o1.unsafe_raw_value() == "one");
    assert (oE.unsafe_raw_value() == "");
  }
}